

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O3

void load_loc_bitmap(Am_Object *obj,char *name)

{
  char *file_name;
  Am_Wrapper *pAVar1;
  Am_Object *pAVar2;
  Am_Image_Array icon;
  Am_Object AStack_28;
  Am_Image_Array local_20;
  
  file_name = Am_Merge_Pathname(name);
  Am_Image_Array::Am_Image_Array(&local_20,file_name);
  if (file_name != (char *)0x0) {
    operator_delete__(file_name);
  }
  Am_Object::Create(&AStack_28,(char *)&Am_Bitmap);
  pAVar1 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&local_20);
  pAVar2 = Am_Object::Set(&AStack_28,0xb0,pAVar1,0);
  pAVar1 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar2 = Am_Object::Set(pAVar2,0x6b,pAVar1,0);
  Am_Object::operator=(obj,pAVar2);
  Am_Object::~Am_Object(&AStack_28);
  Am_Image_Array::~Am_Image_Array(&local_20);
  return;
}

Assistant:

void
load_loc_bitmap(Am_Object &obj, const char *name)
{
  const char *pathname = Am_Merge_Pathname(name);
  Am_Image_Array icon = Am_Image_Array(pathname);
  delete[] pathname;
  obj = Am_Bitmap.Create(name).Set(Am_IMAGE, icon).Set(Am_LINE_STYLE, Am_Black);
}